

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int __thiscall
CVmObjFile::getp_get_size(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  long lVar2;
  
  if (getp_get_size(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_size();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_size::desc);
  if (iVar1 == 0) {
    check_valid_file(this);
    lVar2 = get_file_size(this);
    retval->typ = VM_INT;
    (retval->val).obj = (vm_obj_id_t)lVar2;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_get_size(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* get the size */
    retval->set_int(get_file_size(vmg0_));

    /* handled */
    return TRUE;
}